

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O1

int CfdCreateExtPubkey(void *handle,char *extkey,int network_type,char **ext_pubkey)

{
  bool bVar1;
  NetType net_type;
  char *pcVar2;
  CfdException *pCVar3;
  bool is_bitcoin;
  HDWalletApi api;
  string key;
  bool local_73;
  allocator local_72;
  HDWalletApi local_71;
  undefined1 local_70 [32];
  string local_50;
  
  cfd::Initialize();
  if (ext_pubkey == (char **)0x0) {
    local_70._0_8_ = "cfdcapi_key.cpp";
    local_70._8_4_ = 0x75f;
    local_70._16_8_ = "CfdCreateExtPubkey";
    cfd::core::logger::log<>((CfdSourceLocation *)local_70,kCfdLogLevelWarning,"extpubkey is null.")
    ;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Failed to parameter. extpubkey is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(extkey);
  if (!bVar1) {
    local_73 = true;
    net_type = cfd::capi::ConvertNetType(network_type,&local_73);
    if (local_73 != false) {
      std::__cxx11::string::string((string *)&local_50,extkey,&local_72);
      cfd::api::HDWalletApi::CreateExtPubkey((string *)local_70,&local_71,&local_50,net_type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      pcVar2 = cfd::capi::CreateString((string *)local_70);
      *ext_pubkey = pcVar2;
      if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
        operator_delete((void *)local_70._0_8_);
      }
      return 0;
    }
    local_70._0_8_ = "cfdcapi_key.cpp";
    local_70._8_4_ = 0x76e;
    local_70._16_8_ = "CfdCreateExtPubkey";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_70,kCfdLogLevelWarning,
               "privkey\'s network_type is invalid.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Failed to parameter. privkey\'s network_type is invalid.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_70._0_8_ = "cfdcapi_key.cpp";
  local_70._8_4_ = 0x765;
  local_70._16_8_ = "CfdCreateExtPubkey";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_70,kCfdLogLevelWarning,"extkey is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Failed to parameter. extkey is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCreateExtPubkey(
    void* handle, const char* extkey, int network_type, char** ext_pubkey) {
  try {
    cfd::Initialize();
    if (ext_pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "extpubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. extpubkey is null.");
    }
    if (IsEmptyString(extkey)) {
      warn(CFD_LOG_SOURCE, "extkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. extkey is null or empty.");
    }

    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }
    HDWalletApi api;
    std::string key = api.CreateExtPubkey(extkey, net_type);
    *ext_pubkey = CreateString(key);

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}